

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

QModelIndexList * __thiscall QTableView::selectedIndexes(QTableView *this)

{
  bool bVar1;
  uint uVar2;
  qsizetype qVar3;
  const_reference pQVar4;
  long *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  int i;
  QTableViewPrivate *d;
  QModelIndexList *viewSelected;
  QModelIndex index;
  QModelIndexList modelSelected;
  parameter_type in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  QModelIndex *this_00;
  int local_88;
  undefined1 *local_50;
  undefined1 *local_48;
  QAbstractItemModel *local_40;
  QList<QModelIndex> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QTableView *)0x8bc872);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x8bc8a6);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x8bc8e0);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8bc8f1);
  if (bVar1) {
    QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8bc908);
    QItemSelectionModel::selectedIndexes();
    QList<QModelIndex>::operator=
              ((QList<QModelIndex> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               (QList<QModelIndex> *)in_stack_ffffffffffffff48);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8bc93a);
  }
  for (local_88 = 0; qVar3 = QList<QModelIndex>::size(&local_20), local_88 < qVar3;
      local_88 = local_88 + 1) {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = QList<QModelIndex>::at
                       ((QList<QModelIndex> *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        (qsizetype)in_stack_ffffffffffffff48);
    local_50 = *(undefined1 **)pQVar4;
    local_48 = (undefined1 *)pQVar4->i;
    local_40 = (pQVar4->m).ptr;
    uVar2 = (**(code **)(*in_RSI + 0x2c0))(in_RSI,&local_50);
    in_stack_ffffffffffffff57 = false;
    if ((uVar2 & 1) == 0) {
      QModelIndex::parent(this_00);
      in_stack_ffffffffffffff57 =
           ::operator==((QModelIndex *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
                        ,(QPersistentModelIndex *)in_stack_ffffffffffffff48);
    }
    if ((bool)in_stack_ffffffffffffff57 != false) {
      QList<QModelIndex>::append
                ((QList<QModelIndex> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
                 ,in_stack_ffffffffffffff48);
    }
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8bca40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QModelIndexList *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndexList QTableView::selectedIndexes() const
{
    Q_D(const QTableView);
    QModelIndexList viewSelected;
    QModelIndexList modelSelected;
    if (d->selectionModel)
        modelSelected = d->selectionModel->selectedIndexes();
    for (int i = 0; i < modelSelected.size(); ++i) {
        QModelIndex index = modelSelected.at(i);
        if (!isIndexHidden(index) && index.parent() == d->root)
            viewSelected.append(index);
    }
    return viewSelected;
}